

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yprp_augment(lys_ypr_ctx_conflict *pctx,lysp_node_augment *aug)

{
  uint16_t *puVar1;
  lysp_node *node;
  lysp_node_action *action;
  lysp_node_notif *notif;
  lysp_node_notif **pplVar2;
  lysp_node **pplVar3;
  lysp_node_action **pplVar4;
  
  ypr_open(pctx,"augment","target-node",(aug->field_0).node.name,'\x01');
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  yprp_extension_instances(pctx,LY_STMT_AUGMENT,'\0',(aug->field_0).node.exts,(int8_t *)0x0);
  yprp_when(pctx,aug->when,(int8_t *)0x0);
  yprp_iffeatures(pctx,(aug->field_0).node.iffeatures,(aug->field_0).node.exts,(int8_t *)0x0);
  ypr_status(pctx,(aug->field_0).node.flags,(aug->field_0).node.exts,(int8_t *)0x0);
  ypr_description(pctx,(aug->field_0).node.dsc,(aug->field_0).node.exts,(int8_t *)0x0);
  ypr_reference(pctx,(aug->field_0).node.ref,(aug->field_0).node.exts,(int8_t *)0x0);
  pplVar3 = &aug->child;
  while (node = *pplVar3, node != (lysp_node *)0x0) {
    yprp_node(pctx,node);
    pplVar3 = &node->next;
  }
  pplVar4 = &aug->actions;
  while (action = *pplVar4, action != (lysp_node_action *)0x0) {
    yprp_action(pctx,action);
    pplVar4 = &(action->field_0).field_1.next;
  }
  pplVar2 = &aug->notifs;
  while (notif = *pplVar2, notif != (lysp_node_notif *)0x0) {
    yprp_notification(pctx,notif);
    pplVar2 = &(notif->field_0).field_1.next;
  }
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 - 1;
  ypr_close(pctx,"augment",'\x01');
  return;
}

Assistant:

static void
yprp_augment(struct lys_ypr_ctx *pctx, const struct lysp_node_augment *aug)
{
    struct lysp_node *child;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;

    ypr_open(pctx, "augment", "target-node", aug->nodeid, 1);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_AUGMENT, 0, aug->exts, NULL);
    yprp_when(pctx, aug->when, NULL);
    yprp_iffeatures(pctx, aug->iffeatures, aug->exts, NULL);
    ypr_status(pctx, aug->flags, aug->exts, NULL);
    ypr_description(pctx, aug->dsc, aug->exts, NULL);
    ypr_reference(pctx, aug->ref, aug->exts, NULL);

    LY_LIST_FOR(aug->child, child) {
        yprp_node(pctx, child);
    }

    LY_LIST_FOR(aug->actions, action) {
        yprp_action(pctx, action);
    }

    LY_LIST_FOR(aug->notifs, notif) {
        yprp_notification(pctx, notif);
    }

    LEVEL--;
    ypr_close(pctx, "augment", 1);
}